

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

uint64_t __thiscall
libtorrent::aux::anon_unknown_119::last_optimistic_unchoke_cmp::get_ext_priority
          (last_optimistic_unchoke_cmp *this,opt_unchoke_candidate *peer)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  pointer psVar5;
  undefined8 local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined8 local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  uVar4 = peer->ext_priority;
  if (uVar4 == 0xfffffffffffffffe) {
    peer->ext_priority = 0xffffffffffffffff;
    psVar1 = (this->plugins->
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = 0xffffffffffffffff;
    for (psVar5 = (this->plugins->
                  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1)
    {
      peVar2 = (psVar5->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ::std::__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<libtorrent::aux::peer_connection,void>
                ((__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_58,
                 &peer->peer->
                  super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>);
      local_48 = local_58;
      a_Stack_40[0]._M_pi = _Stack_50._M_pi;
      local_58 = 0;
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar3 = (*peVar2->_vptr_plugin[10])(peVar2,&local_48);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_40);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_50);
      uVar4 = CONCAT44(extraout_var,iVar3);
      if (peer->ext_priority < CONCAT44(extraout_var,iVar3)) {
        uVar4 = peer->ext_priority;
      }
      peer->ext_priority = uVar4;
    }
  }
  return uVar4;
}

Assistant:

uint64_t get_ext_priority(opt_unchoke_candidate const& peer) const
			{
#ifndef TORRENT_DISABLE_EXTENSIONS
				if (peer.ext_priority == priority_undetermined)
				{
					peer.ext_priority = std::numeric_limits<uint64_t>::max();
					for (auto& e : plugins)
					{
						uint64_t const priority = e->get_unchoke_priority(peer_connection_handle(*peer.peer));
						peer.ext_priority = std::min(priority, peer.ext_priority);
					}
				}
				return peer.ext_priority;
#else
				TORRENT_UNUSED(peer);
				return std::numeric_limits<uint64_t>::max();
#endif
			}